

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O2

_Bool uint_tbl_next_at(uint_tbl *tbl,uint key,uint *pkey,void **pentry)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  void *pvVar4;
  
  uVar1 = tbl->nrows;
  uVar2 = (ulong)key;
  uVar3 = 0xffffffff;
  do {
    if (uVar1 <= uVar2) {
      pvVar4 = (void *)0x0;
LAB_0015b729:
      *pkey = uVar3;
      *pentry = pvVar4;
      return uVar2 < uVar1;
    }
    pvVar4 = tbl->rows[uVar2];
    if (pvVar4 != (void *)0x0) {
      uVar3 = (uint)uVar2;
      goto LAB_0015b729;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static bool uint_tbl_next_at(struct uint_tbl *tbl, unsigned int key,
                             unsigned int *pkey, void **pentry)
{
  for(; key < tbl->nrows; ++key) {
    if(tbl->rows[key]) {
      *pkey = key;
      *pentry = tbl->rows[key];
      return TRUE;
    }
  }
  *pkey = UINT_MAX;  /* always invalid */
  *pentry = NULL;
  return FALSE;
}